

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O2

int __thiscall
TPZCompElHDiv<pzshape::TPZShapeTriang>::NConnectShapeF
          (TPZCompElHDiv<pzshape::TPZShapeTriang> *this,int connect,int order)

{
  int iVar1;
  
  if (this->fhdivfam == EHDivConstant) {
    iVar1 = TPZShapeHDivConstant<pzshape::TPZShapeTriang>::ComputeNConnectShapeF
                      ((TPZShapeHDivConstant<pzshape::TPZShapeTriang> *)(ulong)(uint)connect,order,
                       order);
    return iVar1;
  }
  if (this->fhdivfam == EHDivStandard) {
    iVar1 = TPZShapeHDiv<pzshape::TPZShapeTriang>::ComputeNConnectShapeF(connect,order);
    return iVar1;
  }
  return -1;
}

Assistant:

int TPZCompElHDiv<TSHAPE>::NConnectShapeF(int connect, int order)const
{
#ifdef DEBUG
    if (connect < 0 || connect > TSHAPE::NFacets) {
        DebugStop();
    }
#endif
    switch (fhdivfam)
    {
    case HDivFamily::EHDivStandard:
        return TPZShapeHDiv<TSHAPE>::ComputeNConnectShapeF(connect,order);    
        break;
    case HDivFamily::EHDivConstant:
        return TPZShapeHDivConstant<TSHAPE>::ComputeNConnectShapeF(connect,order);
        break;
    
    default:
        return -1;
        break;
    }
    return -1;
 }